

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.h
# Opt level: O2

uint8_t * __thiscall
arangodb::velocypack::AttributeTranslator::translate(AttributeTranslator *this,uint64_t id)

{
  const_iterator cVar1;
  uint8_t *puVar2;
  uint64_t local_8;
  
  local_8 = id;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_unsigned_char_*>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_unsigned_char_*>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x40),&local_8);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = *(uint8_t **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false>
                     ._M_cur + 0x10);
  }
  return puVar2;
}

Assistant:

uint8_t const* translate(uint64_t id) const noexcept {
    auto it = _idToKey.find(id);

    if (it == _idToKey.end()) {
      return nullptr;
    }

    return (*it).second;
  }